

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regalloc.cpp
# Opt level: O2

Error __thiscall asmjit::RAPass::resolveCellOffsets(RAPass *this)

{
  RACell *pRVar1;
  uint uVar2;
  RACell *pRVar3;
  int iVar4;
  uint32_t uVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  
  pRVar3 = (RACell *)&this->_memVarCells;
  pRVar1 = this->_memStackCells;
  iVar6 = this->_mem64ByteVarsUsed * 0x40;
  iVar10 = this->_mem32ByteVarsUsed * 0x20 + iVar6;
  iVar9 = this->_mem16ByteVarsUsed * 0x10 + iVar10;
  iVar12 = iVar9 + this->_mem8ByteVarsUsed * 8;
  iVar11 = iVar12 + this->_mem4ByteVarsUsed * 4;
  iVar8 = 0;
  iVar4 = iVar11 + this->_mem2ByteVarsUsed * 2;
  do {
    pRVar3 = pRVar3->next;
    if (pRVar3 == (RACell *)0x0) {
      uVar5 = iVar4 + this->_mem1ByteVarsUsed;
      while( true ) {
        if (pRVar1 == (RACell *)0x0) {
          this->_memAllTotal = uVar5;
          return 0;
        }
        uVar2 = pRVar1->alignment;
        if ((uVar2 ^ uVar2 - 1) <= uVar2 - 1) break;
        uVar2 = -uVar2 & (uVar5 + uVar2) - 1;
        pRVar1->offset = uVar2;
        uVar5 = uVar2 + pRVar1->size;
        pRVar1 = pRVar1->next;
      }
      DebugUtils::assertionFailed
                ("/workspace/llm4binary/github/license_all_cmakelists_25/chenzhuoyu[P]FastRegExp/thirdparty/asmjit/src/asmjit/base/regalloc.cpp"
                 ,0x11e,"alignment != 0 && Utils::isPowerOf2(alignment)");
    }
    uVar5 = pRVar3->size;
    iVar7 = iVar4;
    switch(uVar5) {
    case 1:
      iVar7 = iVar4 + 1;
      break;
    case 2:
      iVar4 = iVar11;
      iVar11 = iVar11 + 2;
      break;
    case 3:
    case 5:
    case 6:
    case 7:
switchD_0011106b_caseD_3:
      DebugUtils::assertionFailed
                ("/workspace/llm4binary/github/license_all_cmakelists_25/chenzhuoyu[P]FastRegExp/thirdparty/asmjit/src/asmjit/base/regalloc.cpp"
                 ,0x112,"ASMJIT_NOT_REACHED has been reached");
    case 4:
      iVar4 = iVar12;
      iVar12 = iVar12 + 4;
      break;
    case 8:
      iVar4 = iVar9;
      iVar9 = iVar9 + 8;
      break;
    default:
      if (uVar5 == 0x10) {
        iVar4 = iVar10;
        iVar10 = iVar10 + 0x10;
      }
      else if (uVar5 == 0x20) {
        iVar4 = iVar6;
        iVar6 = iVar6 + 0x20;
      }
      else {
        if (uVar5 != 0x40) goto switchD_0011106b_caseD_3;
        iVar4 = iVar8;
        iVar8 = iVar8 + 0x40;
      }
    }
    pRVar3->offset = iVar4;
    iVar4 = iVar7;
  } while( true );
}

Assistant:

Error RAPass::resolveCellOffsets() {
  RACell* varCell = _memVarCells;
  RACell* stackCell = _memStackCells;

  uint32_t pos64 = 0;
  uint32_t pos32 = pos64 + _mem64ByteVarsUsed * 64;
  uint32_t pos16 = pos32 + _mem32ByteVarsUsed * 32;
  uint32_t pos8  = pos16 + _mem16ByteVarsUsed * 16;
  uint32_t pos4  = pos8  + _mem8ByteVarsUsed  * 8 ;
  uint32_t pos2  = pos4  + _mem4ByteVarsUsed  * 4 ;
  uint32_t pos1  = pos2  + _mem2ByteVarsUsed  * 2 ;

  // Assign home slots.
  while (varCell) {
    uint32_t size = varCell->size;
    uint32_t offset = 0;

    switch (size) {
      case  1: offset = pos1 ; pos1  += 1 ; break;
      case  2: offset = pos2 ; pos2  += 2 ; break;
      case  4: offset = pos4 ; pos4  += 4 ; break;
      case  8: offset = pos8 ; pos8  += 8 ; break;
      case 16: offset = pos16; pos16 += 16; break;
      case 32: offset = pos32; pos32 += 32; break;
      case 64: offset = pos64; pos64 += 64; break;

      default:
        ASMJIT_NOT_REACHED();
    }

    varCell->offset = static_cast<int32_t>(offset);
    varCell = varCell->next;
  }

  // Assign stack slots.
  uint32_t stackPos = pos1 + _mem1ByteVarsUsed;
  while (stackCell) {
    uint32_t size = stackCell->size;
    uint32_t alignment = stackCell->alignment;
    ASMJIT_ASSERT(alignment != 0 && Utils::isPowerOf2(alignment));

    stackPos = Utils::alignTo(stackPos, alignment);
    stackCell->offset = stackPos;
    stackCell = stackCell->next;

    stackPos += size;
  }

  _memAllTotal = stackPos;
  return kErrorOk;
}